

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# valid.c
# Opt level: O2

xmlElementContentPtr xmlNewDocElementContent(xmlDocPtr doc,xmlChar *name,xmlElementContentType type)

{
  undefined8 in_RAX;
  xmlElementContentPtr pxVar1;
  xmlChar *pxVar2;
  xmlChar *pxVar3;
  char *msg;
  _xmlDict *dict;
  int l;
  
  l = (int)((ulong)in_RAX >> 0x20);
  if (doc == (xmlDocPtr)0x0) {
    dict = (xmlDictPtr)0x0;
  }
  else {
    dict = doc->dict;
  }
  if ((type - XML_ELEMENT_CONTENT_SEQ < 2) || (type == XML_ELEMENT_CONTENT_PCDATA)) {
    if (name != (xmlChar *)0x0) {
      msg = "xmlNewElementContent : name != NULL !\n";
      goto LAB_00189378;
    }
  }
  else {
    if (type != XML_ELEMENT_CONTENT_ELEMENT) {
      xmlErrValid((xmlValidCtxtPtr)0x0,XML_ERR_INTERNAL_ERROR,
                  "Internal: ELEMENT content corrupted invalid type\n",(char *)0x0);
      return (xmlElementContentPtr)0x0;
    }
    if (name == (xmlChar *)0x0) {
      msg = "xmlNewElementContent : name == NULL !\n";
LAB_00189378:
      xmlErrValid((xmlValidCtxtPtr)0x0,XML_ERR_INTERNAL_ERROR,msg,(char *)0x0);
    }
  }
  pxVar1 = (xmlElementContentPtr)(*xmlMalloc)(0x30);
  if (pxVar1 == (xmlElementContentPtr)0x0) {
    xmlVErrMemory((xmlValidCtxtPtr)0x0,"malloc failed");
    return (xmlElementContentPtr)0x0;
  }
  pxVar1->c2 = (_xmlElementContent *)0x0;
  pxVar1->parent = (_xmlElementContent *)0x0;
  pxVar1->prefix = (xmlChar *)0x0;
  pxVar1->name = (xmlChar *)0x0;
  pxVar1->c1 = (_xmlElementContent *)0x0;
  pxVar1->type = type;
  pxVar1->ocur = XML_ELEMENT_CONTENT_ONCE;
  if (name == (xmlChar *)0x0) {
    return pxVar1;
  }
  pxVar2 = xmlSplitQName3(name,&l);
  if (pxVar2 == (xmlChar *)0x0) {
    if (dict == (xmlDictPtr)0x0) goto LAB_00189447;
  }
  else {
    if (dict == (xmlDictPtr)0x0) {
      pxVar3 = xmlStrndup(name,l);
      pxVar1->prefix = pxVar3;
      name = pxVar2;
LAB_00189447:
      pxVar2 = xmlStrdup(name);
      goto LAB_0018944c;
    }
    pxVar3 = xmlDictLookup(dict,name,l);
    pxVar1->prefix = pxVar3;
    name = pxVar2;
  }
  pxVar2 = xmlDictLookup(dict,name,-1);
LAB_0018944c:
  pxVar1->name = pxVar2;
  return pxVar1;
}

Assistant:

xmlElementContentPtr
xmlNewDocElementContent(xmlDocPtr doc, const xmlChar *name,
                        xmlElementContentType type) {
    xmlElementContentPtr ret;
    xmlDictPtr dict = NULL;

    if (doc != NULL)
        dict = doc->dict;

    switch(type) {
	case XML_ELEMENT_CONTENT_ELEMENT:
	    if (name == NULL) {
	        xmlErrValid(NULL, XML_ERR_INTERNAL_ERROR,
			"xmlNewElementContent : name == NULL !\n",
			NULL);
	    }
	    break;
        case XML_ELEMENT_CONTENT_PCDATA:
	case XML_ELEMENT_CONTENT_SEQ:
	case XML_ELEMENT_CONTENT_OR:
	    if (name != NULL) {
	        xmlErrValid(NULL, XML_ERR_INTERNAL_ERROR,
			"xmlNewElementContent : name != NULL !\n",
			NULL);
	    }
	    break;
	default:
	    xmlErrValid(NULL, XML_ERR_INTERNAL_ERROR,
		    "Internal: ELEMENT content corrupted invalid type\n",
		    NULL);
	    return(NULL);
    }
    ret = (xmlElementContentPtr) xmlMalloc(sizeof(xmlElementContent));
    if (ret == NULL) {
	xmlVErrMemory(NULL, "malloc failed");
	return(NULL);
    }
    memset(ret, 0, sizeof(xmlElementContent));
    ret->type = type;
    ret->ocur = XML_ELEMENT_CONTENT_ONCE;
    if (name != NULL) {
        int l;
	const xmlChar *tmp;

	tmp = xmlSplitQName3(name, &l);
	if (tmp == NULL) {
	    if (dict == NULL)
		ret->name = xmlStrdup(name);
	    else
	        ret->name = xmlDictLookup(dict, name, -1);
	} else {
	    if (dict == NULL) {
		ret->prefix = xmlStrndup(name, l);
		ret->name = xmlStrdup(tmp);
	    } else {
	        ret->prefix = xmlDictLookup(dict, name, l);
		ret->name = xmlDictLookup(dict, tmp, -1);
	    }
	}
    }
    return(ret);
}